

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O0

_Bool create_GL_context(SWindowData *window_data)

{
  SWindowData *window_data_00;
  undefined8 uVar1;
  long *in_RDI;
  XVisualInfo *visualInfo;
  GLint glxAttribs [21];
  GLint minorGLX;
  GLint majorGLX;
  SWindowData_X11 *window_data_x11;
  undefined1 local_78 [88];
  int local_20;
  int local_1c;
  undefined8 *local_18;
  _Bool local_1;
  
  local_18 = (undefined8 *)*in_RDI;
  local_20 = 0;
  glXQueryVersion(local_18[1],&local_1c,&local_20);
  if ((local_1c < 2) && (local_20 < 2)) {
    fprintf(_stderr,"GLX 1.2 or greater is required.\n");
    XCloseDisplay(local_18[1]);
    local_1 = false;
  }
  else {
    memcpy(local_78,&DAT_00107a20,0x54);
    window_data_00 =
         (SWindowData *)glXChooseVisual(local_18[1],*(undefined4 *)(local_18 + 2),local_78);
    if (window_data_00 == (SWindowData *)0x0) {
      fprintf(_stderr,"Could not create correct visual window.\n");
      XCloseDisplay(local_18[1]);
      local_1 = false;
    }
    else {
      uVar1 = glXCreateContext(local_18[1],window_data_00,0,1);
      local_18[4] = uVar1;
      glXMakeCurrent(local_18[1],*local_18,local_18[4]);
      init_GL(window_data_00);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool 
create_GL_context(SWindowData *window_data) {
#if defined(_WIN32) || defined(WIN32)
    SWindowData_Win *window_data_win = (SWindowData_Win *) window_data->specific;

    if(setup_pixel_format(window_data_win->hdc) == false)
        return false;
    window_data_win->hGLRC = wglCreateContext(window_data_win->hdc);
    wglMakeCurrent(window_data_win->hdc, window_data_win->hGLRC);
    init_GL(window_data);

    return true;

#elif defined(linux)
    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;

    GLint majorGLX, minorGLX = 0;
    glXQueryVersion(window_data_x11->display, &majorGLX, &minorGLX);
    if (majorGLX <= 1 && minorGLX < 2) {
        fprintf(stderr, "GLX 1.2 or greater is required.\n");
        XCloseDisplay(window_data_x11->display);
        return false;
    }
    else {
        //fprintf(stdout, "GLX version: %d.%d\n", majorGLX, minorGLX);
    }

    GLint glxAttribs[] = {
        GLX_RGBA,
        GLX_DOUBLEBUFFER,
        GLX_DEPTH_SIZE,     24,
        GLX_STENCIL_SIZE,   8,
        GLX_RED_SIZE,       8,
        GLX_GREEN_SIZE,     8,
        GLX_BLUE_SIZE,      8,
        GLX_DEPTH_SIZE,     24,
        GLX_STENCIL_SIZE,   8,
        GLX_SAMPLE_BUFFERS, 0,
        GLX_SAMPLES,        0,
        None
    };
    XVisualInfo* visualInfo = glXChooseVisual(window_data_x11->display, window_data_x11->screen, glxAttribs);
    if (visualInfo == 0) {
        fprintf(stderr, "Could not create correct visual window.\n");
        XCloseDisplay(window_data_x11->display);
        return false;
    }

    window_data_x11->context = glXCreateContext(window_data_x11->display, visualInfo, NULL, GL_TRUE);
    glXMakeCurrent(window_data_x11->display, window_data_x11->window, window_data_x11->context);

    //fprintf(stdout, "GL Vendor: %s\n", glGetString(GL_VENDOR));
    //fprintf(stdout, "GL Renderer: %s\n", glGetString(GL_RENDERER));
    //fprintf(stdout, "GL Version: %s\n", glGetString(GL_VERSION));
    //fprintf(stdout, "GL Shading Language: %s\n", glGetString(GL_SHADING_LANGUAGE_VERSION));

    init_GL(window_data);

    return true;
#endif
}